

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O0

void __thiscall axl::io::ShmtBase::disconnect(ShmtBase *this)

{
  uint uVar1;
  __sighandler_t extraout_RDX;
  int32_t *in_RDI;
  __sighandler_t __handler;
  
  sys::atomicLock(in_RDI);
  uVar1 = *(uint *)(*(long *)(in_RDI + 0x14) + 0xc) | 4;
  __handler = (__sighandler_t)(ulong)uVar1;
  *(uint *)(*(long *)(in_RDI + 0x14) + 0xc) = uVar1;
  if (*(int *)(*(long *)(in_RDI + 0x14) + 0x10) != 0) {
    sys::NamedSemaphore::signal
              ((NamedSemaphore *)(in_RDI + 0x18),*(int *)(*(long *)(in_RDI + 0x14) + 0x10),__handler
              );
    *(undefined4 *)(*(long *)(in_RDI + 0x14) + 0x10) = 0;
    __handler = extraout_RDX;
  }
  if (*(int *)(*(long *)(in_RDI + 0x14) + 0x14) != 0) {
    sys::NamedSemaphore::signal
              ((NamedSemaphore *)(in_RDI + 0x1a),*(int *)(*(long *)(in_RDI + 0x14) + 0x14),__handler
              );
    *(undefined4 *)(*(long *)(in_RDI + 0x14) + 0x14) = 0;
  }
  sys::atomicUnlock(in_RDI);
  return;
}

Assistant:

void
ShmtBase::disconnect() {
	sys::atomicLock(&m_hdr->m_lock);

	m_hdr->m_state |= ShmtState_Disconnected;

	if (m_hdr->m_readSemaphoreWaitCount) {
		m_readSemaphore.signal(m_hdr->m_readSemaphoreWaitCount);
		m_hdr->m_readSemaphoreWaitCount = 0;
	}

	if (m_hdr->m_writeSemaphoreWaitCount) {
		m_writeSemaphore.signal(m_hdr->m_writeSemaphoreWaitCount);
		m_hdr->m_writeSemaphoreWaitCount = 0;
	}

	sys::atomicUnlock(&m_hdr->m_lock);
}